

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void __thiscall ExpressionContext::AddType(ExpressionContext *this,TypeBase *type)

{
  uint uVar1;
  TypeBase **ppTVar2;
  char *__function;
  ScopeData *pSVar3;
  TypeLookupResult value;
  
  pSVar3 = this->scope;
  uVar1 = (pSVar3->types).count;
  if (uVar1 == (pSVar3->types).max) {
    SmallArray<TypeBase_*,_2U>::grow(&pSVar3->types,uVar1);
  }
  ppTVar2 = (pSVar3->types).data;
  if (ppTVar2 == (TypeBase **)0x0) {
    __function = "void SmallArray<TypeBase *, 2>::push_back(const T &) [T = TypeBase *, N = 2]";
  }
  else {
    uVar1 = (pSVar3->types).count;
    (pSVar3->types).count = uVar1 + 1;
    ppTVar2[uVar1] = type;
    uVar1 = (this->types).count;
    if (uVar1 == (this->types).max) {
      SmallArray<TypeBase_*,_128U>::grow(&this->types,uVar1);
    }
    ppTVar2 = (this->types).data;
    if (ppTVar2 != (TypeBase **)0x0) {
      uVar1 = (this->types).count;
      (this->types).count = uVar1 + 1;
      ppTVar2[uVar1] = type;
      if (((type != (TypeBase *)0x0) && (type->typeID == 0x18)) &&
         (*(char *)((long)&type[3]._vptr_TypeBase + 1) != '\0')) {
        return;
      }
      pSVar3 = this->scope;
      if (pSVar3->type == SCOPE_NAMESPACE) {
        pSVar3 = this->globalScope;
      }
      value.alias = (AliasData *)0x0;
      value.type = type;
      DirectChainedMap<TypeLookupResult>::insert(&pSVar3->typeLookupMap,type->nameHash,value);
      return;
    }
    __function = "void SmallArray<TypeBase *, 128>::push_back(const T &) [T = TypeBase *, N = 128]";
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,__function);
}

Assistant:

void ExpressionContext::AddType(TypeBase *type)
{
	scope->types.push_back(type);

	types.push_back(type);

	if(TypeClass *typeClass = getType<TypeClass>(type))
	{
		if(typeClass->isInternal)
			return;
	}

	// Namespaces are allowed only in global scope and namespaced type names are globally accessible through namespace name
	if(scope->type == SCOPE_NAMESPACE)
		globalScope->typeLookupMap.insert(type->nameHash, TypeLookupResult(type));
	else
		scope->typeLookupMap.insert(type->nameHash, TypeLookupResult(type));
}